

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orthogonal_regions.hpp
# Opt level: O0

void __thiscall
afsm::orthogonal::
regions_stack<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
::enter<afsm::test::events::comma>
          (regions_stack<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
           *this,comma *event)

{
  region_table_type *this_00;
  comma *event_local;
  regions_stack<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
  *this_local;
  
  this_00 = top(this);
  regions_table<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
  ::enter<afsm::test::events::comma>(this_00,event);
  return;
}

Assistant:

void
    enter(Event&& event)
    {
        top().enter(::std::forward<Event>(event));
    }